

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall
pbrt::StatsAccumulator::ReportRareCheck
          (StatsAccumulator *this,char *condition,Float maxFrequency,int64_t numTrue,int64_t total)

{
  Stats *pSVar1;
  undefined1 auVar2 [16];
  iterator iVar3;
  mapped_type *pmVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  allocator<char> local_6d;
  Float local_6c;
  key_type local_68;
  undefined4 local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pSVar1 = this->stats;
  local_6c = maxFrequency;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,condition,(allocator<char> *)&local_44);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
          ::find(&(pSVar1->rareChecks)._M_t,&local_68);
  pSVar1 = this->stats;
  std::__cxx11::string::~string((string *)&local_68);
  if ((_Rb_tree_header *)iVar3._M_node == &(pSVar1->rareChecks)._M_t._M_impl.super__Rb_tree_header)
  {
    uStack_40 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    uStack_34 = 0;
    pSVar1 = this->stats;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,condition,&local_6d);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
             ::operator[](&pSVar1->rareChecks,&local_68);
    pmVar4->maxFrequency = local_6c;
    *(ulong *)&pmVar4->field_0x4 = CONCAT44(uStack_40,local_44);
    *(ulong *)((long)&pmVar4->numTrue + 4) = CONCAT44(uStack_38,uStack_3c);
    *(undefined4 *)((long)&pmVar4->total + 4) = uStack_34;
    std::__cxx11::string::~string((string *)&local_68);
  }
  pSVar1 = this->stats;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,condition,(allocator<char> *)&local_44);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::StatsAccumulator::Stats::RareCheck>_>_>
           ::operator[](&pSVar1->rareChecks,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = total;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = numTrue;
  auVar5 = vpunpcklqdq_avx(auVar6,auVar5);
  auVar2._0_8_ = pmVar4->numTrue;
  auVar2._8_8_ = pmVar4->total;
  auVar2 = vpaddq_avx(auVar5,auVar2);
  pmVar4->numTrue = auVar2._0_8_;
  pmVar4->total = auVar2._8_8_;
  return;
}

Assistant:

void StatsAccumulator::ReportRareCheck(const char *condition, Float maxFrequency,
                                       int64_t numTrue, int64_t total) {
    if (stats->rareChecks.find(condition) == stats->rareChecks.end())
        stats->rareChecks[condition] = Stats::RareCheck(maxFrequency);
    Stats::RareCheck &rc = stats->rareChecks[condition];
    rc.numTrue += numTrue;
    rc.total += total;
}